

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronFreeRules(xmlSchematronRulePtr_conflict rules)

{
  xmlSchematronRulePtr pxVar1;
  xmlSchematronRulePtr_conflict next;
  xmlSchematronRulePtr_conflict rules_local;
  
  next = rules;
  while (next != (xmlSchematronRulePtr_conflict)0x0) {
    pxVar1 = next->next;
    if (next->tests != (xmlSchematronTestPtr_conflict)0x0) {
      xmlSchematronFreeTests(next->tests);
    }
    if (next->context != (xmlChar *)0x0) {
      (*xmlFree)(next->context);
    }
    if (next->pattern != (xmlPatternPtr)0x0) {
      xmlFreePattern(next->pattern);
    }
    if (next->report != (xmlChar *)0x0) {
      (*xmlFree)(next->report);
    }
    (*xmlFree)(next);
    next = pxVar1;
  }
  return;
}

Assistant:

static void
xmlSchematronFreeRules(xmlSchematronRulePtr rules) {
    xmlSchematronRulePtr next;

    while (rules != NULL) {
        next = rules->next;
	if (rules->tests)
	    xmlSchematronFreeTests(rules->tests);
	if (rules->context != NULL)
	    xmlFree(rules->context);
	if (rules->pattern)
	    xmlFreePattern(rules->pattern);
	if (rules->report != NULL)
	    xmlFree(rules->report);
	xmlFree(rules);
	rules = next;
    }
}